

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp.cpp
# Opt level: O0

void Commands::WarpToMe(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from)

{
  World *pWVar1;
  Character *pCVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  const_reference pvVar7;
  Character *pCVar8;
  mapped_type *pmVar9;
  WarpAnimation local_1ad;
  byte local_1aa;
  allocator<char> local_129;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  key_type local_e0;
  byte local_ba;
  allocator<char> local_b9;
  undefined1 local_b8 [6];
  bool bubbles;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_40;
  Character *local_20;
  Character *victim;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  pWVar1 = from->world;
  victim = from;
  from_local = (Character *)arguments;
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](arguments,0);
  std::__cxx11::string::string((string *)&local_40,(string *)pvVar7);
  pCVar8 = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pCVar2 = victim;
  local_20 = pCVar8;
  if ((pCVar8 == (Character *)0x0) || ((pCVar8->nowhere & 1U) != 0)) {
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"character_not_found",&local_91);
    I18N::Format<>(&local_70,&pWVar1->i18n,&local_90);
    (*(pCVar2->super_Command_Source)._vptr_Command_Source[5])(pCVar2,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  else {
    uVar4 = (**(pCVar8->super_Command_Source)._vptr_Command_Source)();
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"cmdprotect",&local_b9);
    pmVar9 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->admin_config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,(key_type *)local_b8);
    iVar5 = util::variant::operator_cast_to_int(pmVar9);
    bVar3 = true;
    if (iVar5 <= (int)(uVar4 & 0xff)) {
      uVar4 = (**(local_20->super_Command_Source)._vptr_Command_Source)();
      uVar6 = (**(victim->super_Command_Source)._vptr_Command_Source)();
      bVar3 = (uVar4 & 0xff) <= (uVar6 & 0xff);
    }
    std::__cxx11::string::~string((string *)local_b8);
    std::allocator<char>::~allocator(&local_b9);
    pCVar2 = victim;
    if (bVar3) {
      pWVar1 = victim->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"WarpBubbles",&local_e1);
      pmVar9 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_e0);
      bVar3 = util::variant::operator_cast_to_bool(pmVar9);
      local_1aa = 0;
      if (bVar3) {
        bVar3 = Character::IsHideWarp(victim);
        local_1aa = 0;
        if (!bVar3) {
          bVar3 = Character::IsHideWarp(local_20);
          local_1aa = bVar3 ^ 0xff;
        }
      }
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      local_ba = local_1aa & 1;
      local_1ad = WARP_ANIMATION_ADMIN;
      if (local_ba == 0) {
        local_1ad = WARP_ANIMATION_NONE;
      }
      Character::Warp(local_20,victim->mapid,victim->x,victim->y,local_1ad);
    }
    else {
      pWVar1 = victim->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"command_access_denied",&local_129);
      I18N::Format<>(&local_108,&pWVar1->i18n,&local_128);
      (*(pCVar2->super_Command_Source)._vptr_Command_Source[5])(pCVar2,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
    }
  }
  return;
}

Assistant:

void WarpToMe(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			bool bubbles = from->world->config["WarpBubbles"] && !from->IsHideWarp() && !victim->IsHideWarp();
			victim->Warp(from->mapid, from->x, from->y, bubbles ? WARP_ANIMATION_ADMIN : WARP_ANIMATION_NONE);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}